

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_event_pipe.c
# Opt level: O2

ngx_int_t ngx_event_pipe_drain_chains(ngx_event_pipe_t *p)

{
  undefined1 *puVar1;
  ngx_chain_t *pnVar2;
  ngx_chain_t **ppnVar3;
  ngx_int_t nVar4;
  ngx_buf_t *pnVar5;
  ngx_chain_t *pnVar6;
  
  while (((pnVar6 = p->busy, ppnVar3 = &p->busy, pnVar6 != (ngx_chain_t *)0x0 ||
          (pnVar6 = p->out, ppnVar3 = &p->out, pnVar6 != (ngx_chain_t *)0x0)) ||
         (pnVar6 = p->in, ppnVar3 = &p->in, pnVar6 != (ngx_chain_t *)0x0))) {
    *ppnVar3 = (ngx_chain_t *)0x0;
    while (pnVar6 != (ngx_chain_t *)0x0) {
      pnVar5 = pnVar6->buf;
      if ((pnVar5->field_0x49 & 2) != 0) {
        nVar4 = ngx_event_pipe_add_free_buf(p,pnVar5->shadow);
        if (nVar4 != 0) {
          return -6;
        }
        puVar1 = &pnVar6->buf->field_0x48;
        *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfdff;
        pnVar5 = pnVar6->buf;
      }
      pnVar5->shadow = (ngx_buf_t *)0x0;
      pnVar2 = pnVar6->next;
      pnVar6->next = p->free;
      p->free = pnVar6;
      pnVar6 = pnVar2;
    }
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_event_pipe_drain_chains(ngx_event_pipe_t *p)
{
    ngx_chain_t  *cl, *tl;

    for ( ;; ) {
        if (p->busy) {
            cl = p->busy;
            p->busy = NULL;

        } else if (p->out) {
            cl = p->out;
            p->out = NULL;

        } else if (p->in) {
            cl = p->in;
            p->in = NULL;

        } else {
            return NGX_OK;
        }

        while (cl) {
            if (cl->buf->last_shadow) {
                if (ngx_event_pipe_add_free_buf(p, cl->buf->shadow) != NGX_OK) {
                    return NGX_ABORT;
                }

                cl->buf->last_shadow = 0;
            }

            cl->buf->shadow = NULL;
            tl = cl->next;
            cl->next = p->free;
            p->free = cl;
            cl = tl;
        }
    }
}